

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O3

ares_status_t ares_buf_append_be32(ares_buf_t *buf,uint u32)

{
  ares_status_t aVar1;
  
  aVar1 = ares_buf_ensure_space(buf,1);
  if (aVar1 == ARES_SUCCESS) {
    buf->alloc_buf[buf->data_len] = (uchar)(u32 >> 0x18);
    buf->data_len = buf->data_len + 1;
    aVar1 = ares_buf_ensure_space(buf,1);
    if (aVar1 == ARES_SUCCESS) {
      buf->alloc_buf[buf->data_len] = (uchar)(u32 >> 0x10);
      buf->data_len = buf->data_len + 1;
      aVar1 = ares_buf_ensure_space(buf,1);
      if (aVar1 == ARES_SUCCESS) {
        buf->alloc_buf[buf->data_len] = (uchar)(u32 >> 8);
        buf->data_len = buf->data_len + 1;
        aVar1 = ares_buf_ensure_space(buf,1);
        if (aVar1 == ARES_SUCCESS) {
          buf->alloc_buf[buf->data_len] = (uchar)u32;
          buf->data_len = buf->data_len + 1;
          aVar1 = ARES_SUCCESS;
        }
      }
    }
  }
  return aVar1;
}

Assistant:

ares_status_t ares_buf_append_be32(ares_buf_t *buf, unsigned int u32)
{
  ares_status_t status;

  status = ares_buf_append_byte(buf, ((unsigned char)(u32 >> 24) & 0xff));
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_buf_append_byte(buf, ((unsigned char)(u32 >> 16) & 0xff));
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_buf_append_byte(buf, ((unsigned char)(u32 >> 8) & 0xff));
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_buf_append_byte(buf, ((unsigned char)u32 & 0xff));
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  return ARES_SUCCESS;
}